

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

cmpResult __thiscall llvm::APFloat::compare(APFloat *this,APFloat *RHS)

{
  bool bVar1;
  fltSemantics *pfVar2;
  fltSemantics *pfVar3;
  APFloat *RHS_local;
  APFloat *this_local;
  
  pfVar2 = getSemantics(this);
  pfVar3 = getSemantics(RHS);
  if (pfVar2 != pfVar3) {
    __assert_fail("&getSemantics() == &RHS.getSemantics() && \"Should only compare APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,0x450,"cmpResult llvm::APFloat::compare(const APFloat &) const");
  }
  pfVar2 = getSemantics(this);
  bVar1 = usesLayout<llvm::detail::IEEEFloat>(pfVar2);
  if (bVar1) {
    this_local._4_4_ = detail::IEEEFloat::compare(&(this->U).IEEE,&(RHS->U).IEEE);
  }
  else {
    pfVar2 = getSemantics(this);
    bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(pfVar2);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                 ,0x455);
    }
    this_local._4_4_ =
         detail::DoubleAPFloat::compare
                   ((DoubleAPFloat *)&(this->U).IEEE,(DoubleAPFloat *)&(RHS->U).IEEE);
  }
  return this_local._4_4_;
}

Assistant:

cmpResult compare(const APFloat &RHS) const {
    assert(&getSemantics() == &RHS.getSemantics() &&
           "Should only compare APFloats with the same semantics");
    if (usesLayout<IEEEFloat>(getSemantics()))
      return U.IEEE.compare(RHS.U.IEEE);
    if (usesLayout<DoubleAPFloat>(getSemantics()))
      return U.Double.compare(RHS.U.Double);
    llvm_unreachable("Unexpected semantics");
  }